

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_key_exchange(EC_GROUP *group,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
                      ptls_iovec_t peerkey,BN_CTX *bn_ctx)

{
  int iVar1;
  EC_POINT *pub_key;
  void *pvVar2;
  undefined8 *in_RDX;
  BN_CTX *in_RSI;
  EC_GROUP *in_RDI;
  ptls_iovec_t pVar3;
  int ret;
  EC_KEY *privkey;
  EC_POINT *peer_point;
  EC_GROUP *in_stack_ffffffffffffff48;
  BN_CTX *in_stack_ffffffffffffff50;
  BN_CTX *bn_ctx_00;
  EC_POINT *in_stack_ffffffffffffff58;
  EC_GROUP *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  uint8_t *local_88;
  size_t local_80;
  int local_44;
  EC_KEY *local_40;
  
  local_40 = (EC_KEY *)0x0;
  *(undefined8 *)in_RSI = 0;
  *(undefined8 *)(in_RSI + 8) = 0;
  *in_RDX = 0;
  in_RDX[1] = 0;
  pVar3.len = in_stack_ffffffffffffff68;
  pVar3.base = (uint8_t *)in_stack_ffffffffffffff60;
  pub_key = x9_62_decode_point((EC_GROUP *)in_stack_ffffffffffffff58,pVar3,in_stack_ffffffffffffff50
                              );
  if (pub_key == (EC_POINT *)0x0) {
    local_44 = 0x32;
  }
  else {
    local_40 = (EC_KEY *)ecdh_gerenate_key(in_stack_ffffffffffffff48);
    if (local_40 == (EC_KEY *)0x0) {
      local_44 = 0x201;
    }
    else {
      bn_ctx_00 = in_RSI;
      EC_KEY_get0_public_key(local_40);
      pVar3 = x9_62_encode_point(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,bn_ctx_00);
      local_88 = pVar3.base;
      *(uint8_t **)bn_ctx_00 = local_88;
      local_80 = pVar3.len;
      *(size_t *)(bn_ctx_00 + 8) = local_80;
      if (*(long *)bn_ctx_00 == 0) {
        local_44 = 0x201;
      }
      else {
        iVar1 = EC_GROUP_get_degree(in_RDI);
        in_RDX[1] = (long)((iVar1 + 7) / 8);
        pvVar2 = malloc(in_RDX[1]);
        *in_RDX = pvVar2;
        if (pvVar2 == (void *)0x0) {
          local_44 = 0x201;
        }
        else {
          iVar1 = ECDH_compute_key((void *)*in_RDX,in_RDX[1],(EC_POINT *)pub_key,local_40,(KDF *)0x0
                                  );
          if (iVar1 < 1) {
            local_44 = 0x28;
          }
          else {
            local_44 = 0;
          }
        }
      }
    }
  }
  if (pub_key != (EC_POINT *)0x0) {
    EC_POINT_free((EC_POINT *)pub_key);
  }
  if (local_40 != (EC_KEY *)0x0) {
    EC_KEY_free(local_40);
  }
  if (local_44 != 0) {
    free(*(void **)in_RSI);
    *(undefined8 *)in_RSI = 0;
    *(undefined8 *)(in_RSI + 8) = 0;
    free((void *)*in_RDX);
    *in_RDX = 0;
    in_RDX[1] = 0;
  }
  return local_44;
}

Assistant:

static int x9_62_key_exchange(EC_GROUP *group, ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey, BN_CTX *bn_ctx)
{
    EC_POINT *peer_point = NULL;
    EC_KEY *privkey = NULL;
    int ret;

    *pubkey = (ptls_iovec_t){NULL};
    *secret = (ptls_iovec_t){NULL};

    /* decode peer key */
    if ((peer_point = x9_62_decode_point(group, peerkey, bn_ctx)) == NULL) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    /* create private key */
    if ((privkey = ecdh_gerenate_key(group)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* encode public key */
    if ((*pubkey = x9_62_encode_point(group, EC_KEY_get0_public_key(privkey), bn_ctx)).base == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* calc secret */
    secret->len = (EC_GROUP_get_degree(group) + 7) / 8;
    if ((secret->base = malloc(secret->len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* ecdh! */
    if (ECDH_compute_key(secret->base, secret->len, peer_point, privkey, NULL) <= 0) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE; /* ??? */
        goto Exit;
    }

    ret = 0;

Exit:
    if (peer_point != NULL)
        EC_POINT_free(peer_point);
    if (privkey != NULL)
        EC_KEY_free(privkey);
    if (ret != 0) {
        free(pubkey->base);
        *pubkey = (ptls_iovec_t){NULL};
        free(secret->base);
        *secret = (ptls_iovec_t){NULL};
    }
    return ret;
}